

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O0

bool __thiscall libtorrent::aux::peer_connection::ignore_unchoke_slots(peer_connection *this)

{
  session_interface *psVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  element_type *peVar5;
  undefined1 local_28 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  peer_connection *this_local;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  iVar3 = peer_class_set::num_classes
                    ((peer_class_set *)&(this->super_peer_connection_hot_members).field_0x2c);
  if (iVar3 == 0) {
    return true;
  }
  psVar1 = (this->super_peer_connection_hot_members).m_ses;
  uVar4 = (*(psVar1->super_session_logger)._vptr_session_logger[0x33])
                    (psVar1,&(this->super_peer_connection_hot_members).field_0x2c);
  if ((uVar4 & 1) != 0) {
    return true;
  }
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_28);
  bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
  if (bVar2) {
    psVar1 = (this->super_peer_connection_hot_members).m_ses;
    peVar5 = ::std::
             __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_28);
    uVar4 = (*(psVar1->super_session_logger)._vptr_session_logger[0x33])
                      (psVar1,&peVar5->super_peer_class_set);
    if ((uVar4 & 1) != 0) {
      this_local._7_1_ = true;
      goto LAB_0043fc22;
    }
  }
  this_local._7_1_ = false;
LAB_0043fc22:
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_28);
  return this_local._7_1_;
}

Assistant:

bool peer_connection::ignore_unchoke_slots() const
	{
		TORRENT_ASSERT(is_single_thread());
		if (num_classes() == 0) return true;

		if (m_ses.ignore_unchoke_slots_set(*this)) return true;
		auto t = m_torrent.lock();
		if (t && m_ses.ignore_unchoke_slots_set(*t)) return true;
		return false;
	}